

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O0

Response dispatch_command(Command *cmd,Task *task,DatabaseSnapshot *snap)

{
  variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
  *in_RCX;
  anon_class_16_2_3fdaa394 *in_RDX;
  undefined8 in_RDI;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_CERT_Polska[P]ursadb_libursa_Daemon_cpp:221:9),_const_std::variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>_&>
  _Var1;
  Response RVar2;
  
  _Var1 = std::
          visit<dispatch_command(std::variant<SelectCommand,IndexCommand,IndexFromCommand,IteratorPopCommand,ReindexCommand,CompactCommand,ConfigGetCommand,ConfigSetCommand,StatusCommand,TopologyCommand,PingCommand,TaintCommand,DatasetDropCommand>const&,Task*,DatabaseSnapshot_const*)::__0,std::variant<SelectCommand,IndexCommand,IndexFromCommand,IteratorPopCommand,ReindexCommand,CompactCommand,ConfigGetCommand,ConfigSetCommand,StatusCommand,TopologyCommand,PingCommand,TaintCommand,DatasetDropCommand>const&>
                    (in_RDX,in_RCX);
  RVar2.content.m_value = _Var1.content.m_value;
  RVar2.content._0_8_ = in_RDI;
  return (Response)RVar2.content;
}

Assistant:

Response dispatch_command(const Command &cmd, Task *task,
                          const DatabaseSnapshot *snap) {
    return std::visit(
        [snap, task](const auto &cmd) {
            return execute_command(cmd, task, snap);
        },
        cmd);
}